

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O3

void sysbvm_stackFrame_dumpStackGCRootsToFileNamed(char *filename)

{
  undefined8 *puVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord;
  undefined8 *puVar6;
  long lVar7;
  long in_FS_OFFSET;
  
  __stream = fopen(filename,"wb");
  puVar1 = *(undefined8 **)(in_FS_OFFSET + -0x10);
  do {
    if (puVar1 == (undefined8 *)0x0) {
      fclose(__stream);
      return;
    }
    lVar2 = 0x10;
    switch(*(undefined4 *)(puVar1 + 1)) {
    case 0:
      if (puVar1[2] != 0) {
        lVar2 = 0;
        uVar4 = 0;
        do {
          fprintf(__stream,"%p\n",puVar1[3] + lVar2);
          uVar4 = uVar4 + 1;
          lVar2 = lVar2 + 8;
        } while (uVar4 < (ulong)puVar1[2]);
      }
      goto LAB_00141b1b;
    case 1:
      lVar7 = 0x20;
      lVar5 = 0x18;
      lVar3 = lVar2;
      lVar2 = 0x28;
      goto LAB_00141acb;
    case 2:
      fprintf(__stream,"%p\n",puVar1 + 2);
      fprintf(__stream,"%p\n",puVar1 + 3);
      fprintf(__stream,"%p\n",puVar1 + 4);
      fprintf(__stream,"%p\n",puVar1 + 5);
      fprintf(__stream,"%p\n",puVar1 + 6);
      fprintf(__stream,"%p\n",puVar1 + 7);
      if (puVar1[8] != 0) {
        lVar2 = 0;
        uVar4 = 0;
        do {
          fprintf(__stream,"%p\n",puVar1[9] + lVar2);
          uVar4 = uVar4 + 1;
          lVar2 = lVar2 + 8;
        } while (uVar4 < (ulong)puVar1[8]);
      }
      if (puVar1[10] != 0) {
        lVar2 = 0;
        uVar4 = 0;
        do {
          fprintf(__stream,"%p\n",puVar1[0xb] + lVar2);
          uVar4 = uVar4 + 1;
          lVar2 = lVar2 + 8;
        } while (uVar4 < (ulong)puVar1[10]);
      }
      lVar2 = 0;
      do {
        fprintf(__stream,"%p\n",(long)puVar1 + lVar2 + 0x60);
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x200);
      lVar2 = 0x260;
      break;
    case 3:
      fprintf(__stream,"%p\n",puVar1 + 4);
      fprintf(__stream,"%p\n",puVar1 + 5);
      fprintf(__stream,"%p\n",puVar1 + 6);
      if (puVar1[7] != 0) {
        lVar2 = 0;
        uVar4 = 0;
        do {
          fprintf(__stream,"%p\n",puVar1[8] + lVar2);
          uVar4 = uVar4 + 1;
          lVar2 = lVar2 + 8;
        } while (uVar4 < (ulong)puVar1[7]);
      }
      if (puVar1[9] != 0) {
        puVar6 = puVar1 + 10;
        uVar4 = 0;
        do {
          fprintf(__stream,"%p\n",puVar6);
          uVar4 = uVar4 + 1;
          puVar6 = puVar6 + 1;
        } while (uVar4 < (ulong)puVar1[9]);
      }
      if (puVar1[0x1a] != 0) {
        puVar6 = puVar1 + 0x1b;
        uVar4 = 0;
        do {
          fprintf(__stream,"%p\n",puVar6);
          uVar4 = uVar4 + 1;
          puVar6 = puVar6 + 1;
        } while (uVar4 < (ulong)puVar1[0x1a]);
      }
      goto LAB_00141b1b;
    case 4:
    case 5:
    case 6:
    case 8:
      break;
    case 7:
      fprintf(__stream,"%p\n",puVar1 + 2);
      lVar7 = 0x28;
      lVar5 = 0x20;
      lVar3 = 0x18;
      lVar2 = 0x30;
LAB_00141acb:
      fprintf(__stream,"%p\n",lVar3 + (long)puVar1);
      fprintf(__stream,"%p\n",lVar5 + (long)puVar1);
      fprintf(__stream,"%p\n",lVar7 + (long)puVar1);
      break;
    default:
      abort();
    }
    fprintf(__stream,"%p\n",lVar2 + (long)puVar1);
LAB_00141b1b:
    puVar1 = (undefined8 *)*puVar1;
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_dumpStackGCRootsToFileNamed(const char *filename)
{
#ifdef _WIN32
    FILE *file = NULL;
    if(fopen_s(&file, filename, "wb"))
        return;
#else
    FILE *file = fopen(filename, "wb");
#endif
    sysbvm_stackFrame_iterateGCRootsInStackWith(sysbvm_stackFrame_getActiveRecord(), file,  sysbvm_stackFrame_dumpStackGCRoots_iteration);
    fclose(file);
}